

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

bool __thiscall cfd::Psbt::HasAllUtxos(Psbt *this)

{
  long lVar1;
  CfdException *pCVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  allocator local_39;
  undefined1 local_38 [32];
  
  lVar1 = *(long *)&this->field_0x8;
  if (lVar1 == 0) {
    local_38._0_8_ = "cfd_psbt.cpp";
    local_38._8_4_ = 0xef;
    local_38._16_8_ = "HasAllUtxos";
    core::logger::warn<>((CfdSourceLocation *)local_38,"psbt pointer is null");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)local_38,"psbt pointer is null.",&local_39);
    core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_38);
    __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (*(long *)(lVar1 + 8) != 0) {
    lVar3 = 8;
    lVar4 = *(long *)(lVar1 + 0x18);
    while( true ) {
      bVar5 = lVar4 == 0;
      lVar4 = lVar4 + -1;
      if (bVar5) {
        return *(long *)(lVar1 + 0x18) != 0;
      }
      if ((*(long *)(*(long *)(lVar1 + 0x10) + lVar3) == 0) &&
         (*(long *)(*(long *)(lVar1 + 0x10) + -8 + lVar3) == 0)) break;
      lVar3 = lVar3 + 0x110;
    }
    return false;
  }
  local_38._0_8_ = "cfd_psbt.cpp";
  local_38._8_4_ = 0xf3;
  local_38._16_8_ = "HasAllUtxos";
  core::logger::warn<>((CfdSourceLocation *)local_38,"psbt base tx is null");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)local_38,"psbt base tx is null.",&local_39);
  core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_38);
  __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

bool Psbt::HasAllUtxos() const {
  struct wally_psbt* psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(
        CfdError::kCfdIllegalStateError, "psbt pointer is null.");
  } else if (psbt_pointer->tx == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt base tx is null");
    throw CfdException(
        CfdError::kCfdIllegalStateError, "psbt base tx is null.");
  }

  for (size_t index = 0; index < psbt_pointer->num_inputs; ++index) {
    if ((psbt_pointer->inputs[index].witness_utxo == nullptr) &&
        (psbt_pointer->inputs[index].utxo == nullptr)) {
      return false;
    }
  }
  return (psbt_pointer->num_inputs != 0);
}